

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_size
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  undefined4 extraout_var_01;
  mapped_type_conflict *pmVar5;
  bool passed;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool *pbVar9;
  uint uVar10;
  int iVar11;
  pointer piVar12;
  bool bVar13;
  allocator<char> local_4bb;
  allocator<char> local_4ba;
  allocator<char> local_4b9;
  LayoutBindingTestResult *local_4b8;
  LayoutBindingProgram *local_4b0;
  ulong local_4a8;
  String local_4a0;
  String local_480;
  string *local_460;
  StringVector list;
  String decl;
  vector<int,_std::allocator<int>_> arraySizes;
  string local_3d8 [32];
  String local_3b8;
  string local_398 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  String local_360;
  String local_340;
  StringIntMap bindingPoints;
  StringStream s;
  
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x21])(this);
  makeSparseRange(&arraySizes,this,iVar2,1);
  local_460 = (string *)&__return_storage_ptr__->m_reason;
  passed = true;
  piVar12 = arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  local_4b8 = __return_storage_ptr__;
  do {
    if (arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish <= piVar12) {
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      LayoutBindingTestResult::LayoutBindingTestResult(local_4b8,passed,(String *)&s,false);
      std::__cxx11::string::~string((string *)&s);
      break;
    }
    local_4a8 = (ulong)*piVar12;
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,*(char **)CONCAT44(extraout_var,iVar2),&local_4b9);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
    uVar6 = (uint)local_4a8;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&bindingPoints,this,(ulong)(iVar2 + ~uVar6));
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,*(char **)(CONCAT44(extraout_var_00,iVar2) + 0x18),&local_4ba);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&list,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_480,this,&list);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_3d8,this,0);
    std::__cxx11::string::string<std::allocator<char>>(local_398,"float",&local_4bb);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_3b8,this,local_3d8,local_398);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_340,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
              (&local_360,this,local_4a8);
    buildUniformDecl(&decl,this,(String *)&s,(String *)&bindingPoints,&local_4a0,&local_480,
                     &local_3b8,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&list);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&bindingPoints);
    std::__cxx11::string::~string((string *)&s);
    setTemplateParam(this,"UNIFORM_DECL",&decl);
    StringStream::StringStream(&s);
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)local_4a8) {
      uVar8 = local_4a8 & 0xffffffff;
      uVar10 = 0;
    }
    while( true ) {
      if ((uint)uVar8 == uVar10) break;
      pbVar9 = (bool *)0x182f9dd;
      if (uVar10 == 0) {
        pbVar9 = fixed_sample_locations_values + 1;
      }
      poVar4 = std::operator<<((ostream *)&s,pbVar9);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                (&local_4a0,this,0,(ulong)uVar10);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                ((string *)&bindingPoints,this,&local_4a0);
      std::operator<<(poVar4,(string *)&bindingPoints);
      std::__cxx11::string::~string((string *)&bindingPoints);
      std::__cxx11::string::~string((string *)&local_4a0);
      uVar10 = uVar10 + 1;
    }
    std::operator<<((ostream *)&s,";\n");
    std::__cxx11::stringbuf::str();
    setTemplateParam(this,"UNIFORM_ACCESS",(String *)&bindingPoints);
    std::__cxx11::string::~string((string *)&bindingPoints);
    updateTemplate(this);
    iVar2 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])();
    local_4b0 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar2);
    bVar1 = LayoutBindingProgram::compiledAndLinked(local_4b0);
    bVar13 = passed != false;
    passed = bVar13 && bVar1;
    if (bVar13 && bVar1) {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar10 = 0; (uint)uVar8 != uVar10; uVar10 = uVar10 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingPoints);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_4a0,this,0);
        std::operator<<((ostream *)&bindingPoints,(string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4a0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_480,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (&local_4a0,this,&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        if (local_4a0._M_string_length != 0) {
          std::operator<<((ostream *)&bindingPoints,"_block");
        }
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                  (&local_480,this,(ulong)uVar10);
        std::operator<<((ostream *)&bindingPoints,(string *)&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                   &local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingPoints);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_378,&list);
      (*local_4b0->_vptr_LayoutBindingProgram[3])((String *)&bindingPoints,local_4b0,&local_378);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&bindingPoints,
                              list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar7);
        iVar11 = (int)uVar7 + ~uVar6;
        if ((passed == false) || (iVar2 + iVar11 != *pmVar5)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,"binding point did not match default",
                     (allocator<char> *)&local_3b8);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)&bindingPoints,
                                list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar7);
          iVar2 = *pmVar5;
          iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this)
          ;
          generateLog<int,int>(&local_4a0,this,&local_480,iVar2,iVar11 + iVar3);
          local_4b8->m_passed = false;
          local_4b8->m_notRunForThisContext = false;
          std::__cxx11::string::string(local_460,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_480);
          passed = false;
          break;
        }
        passed = true;
      }
      bVar1 = (long)local_4a8 <= (long)uVar7;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&bindingPoints._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
    }
    else {
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,local_4b0,false);
      local_4b8->m_passed = false;
      local_4b8->m_notRunForThisContext = false;
      std::__cxx11::string::string(local_460,(string *)&bindingPoints);
      std::__cxx11::string::~string((string *)&bindingPoints);
      bVar1 = false;
      passed = false;
    }
    (*local_4b0->_vptr_LayoutBindingProgram[1])();
    StringStream::~StringStream(&s);
    std::__cxx11::string::~string((string *)&decl);
    piVar12 = piVar12 + 1;
  } while (bVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arraySizes.super__Vector_base<int,_std::allocator<int>_>);
  return local_4b8;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_size(void)
{
	bool passed = true;

	std::vector<int> arraySizes = makeSparseRange(maxArraySize(), 1);
	for (std::vector<int>::iterator it = arraySizes.begin(); it < arraySizes.end(); it++)
	{
		int	arraySize = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings() - arraySize - 1),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= (((maxBindings() - arraySize - 1) + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]],
																   (maxBindings() - arraySize - 1) + idx));
			}
		}
	}

	return LayoutBindingTestResult(passed, String());
}